

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_php_generator.cc
# Opt level: O2

void __thiscall t_php_generator::generate_service(t_php_generator *this,t_service *tservice)

{
  int __oflag;
  int __fd;
  string f_service_name;
  allocator local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (this->classmap_ == true) {
    std::operator+(&local_58,&this->package_dir_,
                   &(this->super_t_oop_generator).super_t_generator.service_name_);
    std::operator+(&local_38,&local_58,".php");
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::string((string *)&local_58,local_38._M_dataplus._M_p,&local_59);
    template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
              (&this->f_service_,(char *)&local_58,__oflag);
    std::__cxx11::string::~string((string *)&local_58);
    generate_service_header(this,tservice,(ostream *)&this->f_service_);
    std::__cxx11::string::~string((string *)&local_38);
  }
  generate_service_interface(this,tservice);
  if (this->rest_ == true) {
    generate_service_rest(this,tservice);
  }
  generate_service_client(this,tservice);
  generate_service_helpers(this,tservice);
  if (this->phps_ == true) {
    generate_service_processor(this,tservice);
  }
  if (this->classmap_ == true) {
    __fd = 0x36c6b8;
    std::operator<<((ostream *)&this->f_service_,(string *)&::endl_abi_cxx11_);
    template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
              (&this->f_service_,__fd);
  }
  return;
}

Assistant:

void t_php_generator::generate_service(t_service* tservice) {
  if(classmap_) {
    string f_service_name = package_dir_ + service_name_ + ".php";
    f_service_.open(f_service_name.c_str());
    generate_service_header(tservice, f_service_);
  }

  // Generate the three main parts of the service (well, two for now in PHP)
  generate_service_interface(tservice);
  if (rest_) {
    generate_service_rest(tservice);
  }
  generate_service_client(tservice);
  generate_service_helpers(tservice);
  if (phps_) {
    generate_service_processor(tservice);
  }

  if(classmap_) {
    // Close service file
    f_service_ << endl;
    f_service_.close();
  }
}